

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

void acutest_message_color_(int color,char *fmt,...)

{
  char *pcVar1;
  char *__s;
  char local_4f8 [8];
  char buffer [1024];
  undefined8 local_48;
  va_list args;
  
  if (((1 < acutest_verbose_level_) && (acutest_current_test_ != (acutest_test_ *)0x0)) &&
     (acutest_cond_failed_ != 0)) {
    args[0].overflow_arg_area = buffer + 0x3f8;
    args[0]._0_8_ = &stack0x00000008;
    local_48 = 0x3000000010;
    __s = local_4f8;
    vsnprintf(__s,0x400,fmt,&local_48);
    buffer[0x3f7] = '\0';
    pcVar1 = strchr(__s,10);
    while (pcVar1 != (char *)0x0) {
      acutest_line_indent_(3 - (uint)(acutest_case_name_[0] == '\0'));
      acutest_colored_printf_(color,"%.*s\n",(ulong)(uint)((int)pcVar1 - (int)__s),__s);
      __s = pcVar1 + 1;
      pcVar1 = strchr(__s,10);
    }
    if (*__s != '\0') {
      acutest_line_indent_(3 - (uint)(acutest_case_name_[0] == '\0'));
      puts(__s);
    }
  }
  return;
}

Assistant:

acutest_message_color_(int color, const char* fmt, ...)
{
    char buffer[TEST_MSG_MAXSIZE];
    char* line_beg;
    char* line_end;
    va_list args;

    if(acutest_verbose_level_ < 2)
        return;

    /* We allow extra message only when something is already wrong in the
     * current test. */
    if(acutest_current_test_ == NULL  ||  !acutest_cond_failed_)
        return;

    va_start(args, fmt);
    vsnprintf(buffer, TEST_MSG_MAXSIZE, fmt, args);
    va_end(args);
    buffer[TEST_MSG_MAXSIZE-1] = '\0';

    line_beg = buffer;
    while(1) {
        line_end = strchr(line_beg, '\n');
        if(line_end == NULL)
            break;
        acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
        acutest_colored_printf_(color, "%.*s\n", (int)(line_end - line_beg), line_beg);
        line_beg = line_end + 1;
    }
    if(line_beg[0] != '\0') {
        acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
        printf("%s\n", line_beg);
    }
}